

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# html.cpp
# Opt level: O2

QString * Html::span(QString *__return_storage_ptr__,QString *text_,HtmlStyle *style)

{
  QString *pQVar1;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_60;
  QString text;
  QArrayDataPointer<char16_t> local_30;
  
  text.d.d = (text_->d).d;
  text.d.ptr = (text_->d).ptr;
  text.d.size = (text_->d).size;
  if (text.d.d != (Data *)0x0) {
    LOCK();
    ((text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::QString((QString *)&local_60,"<");
  QString::QString((QString *)&local_78,"&lt;");
  pQVar1 = (QString *)
           QString::replace((QString *)&text,(QString *)&local_60,(CaseSensitivity)&local_78);
  QString::QString((QString *)&local_90,">");
  QString::QString((QString *)&local_30,"&gt;");
  QString::replace(pQVar1,(QString *)&local_90,(CaseSensitivity)&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QString::QString((QString *)&local_78,"<span %1>%2</span>");
  HtmlStyle::toString((QString *)&local_90,style);
  QString::arg((QString *)&local_60,(int)&local_78,(QChar)(char16_t)&local_90);
  QString::arg((QString *)__return_storage_ptr__,(int)&local_60,(QChar)(char16_t)&text);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&text.d);
  return __return_storage_ptr__;
}

Assistant:

QString Html::span(const QString &text_, const HtmlStyle& style) {
    QString text = text_;
    text.replace("<","&lt;").replace(">","&gt;");
    return QString("<span %1>%2</span>").arg(style.toString()).arg(text);
}